

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

void ImGui::PopColumnsBackground(void)

{
  ImGuiColumns *pIVar1;
  
  pIVar1 = (GImGui->CurrentWindow->DC).CurrentColumns;
  if (pIVar1->Count == 1) {
    return;
  }
  ImDrawList::ChannelsSetCurrent(GImGui->CurrentWindow->DrawList,pIVar1->Current + 1);
  PopClipRect();
  return;
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindowRead()      { ImGuiContext& g = *GImGui; return g.CurrentWindow; }